

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

int KillAll(PClassActor *cls)

{
  bool bVar1;
  int iVar2;
  AActor *this;
  undefined4 extraout_var;
  int iVar4;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator FStack_38;
  PClassActor *pPVar3;
  
  FThinkerIterator::FThinkerIterator(&FStack_38,&cls->super_PClass,0x80);
  iVar4 = 0;
  this = (AActor *)FThinkerIterator::Next(&FStack_38,false);
  if (this != (AActor *)0x0) {
    iVar4 = 0;
    do {
      pPVar3 = (PClassActor *)(this->super_DThinker).super_DObject.Class;
      if (pPVar3 == (PClassActor *)0x0) {
        iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        pPVar3 = (PClassActor *)CONCAT44(extraout_var,iVar2);
        (this->super_DThinker).super_DObject.Class = (PClass *)pPVar3;
      }
      if (((pPVar3 == cls) && (((this->flags2).Value & 0x10000000) == 0)) &&
         (((this->flags3).Value & 0x2000) != 0)) {
        bVar1 = AActor::Massacre(this);
        iVar4 = iVar4 + (uint)bVar1;
      }
      this = (AActor *)FThinkerIterator::Next(&FStack_38,false);
    } while (this != (AActor *)0x0);
  }
  return iVar4;
}

Assistant:

static int KillAll(PClassActor *cls)
{
	AActor *actor;
	int killcount = 0;
	TThinkerIterator<AActor> iterator(cls);
	while ( (actor = iterator.Next ()) )
	{
		if (actor->IsA(cls))
		{
			if (!(actor->flags2 & MF2_DORMANT) && (actor->flags3 & MF3_ISMONSTER))
					killcount += actor->Massacre ();
		}
	}
	return killcount;

}